

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O3

bool Covariance::Inverse<double>(double *A,int size)

{
  size_t __n;
  void *pvVar1;
  int iVar2;
  uint uVar3;
  int j;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  uVar5 = (ulong)(uint)size;
  pvVar1 = operator_new__((ulong)(uint)(size * size) << 3);
  dVar8 = recurse_determinant<double>(A,size);
  if ((0.0 <= dVar8) && (0 < size)) {
    iVar2 = 2;
    uVar6 = 0;
    pvVar7 = pvVar1;
    do {
      uVar4 = 0;
      do {
        dVar9 = pow(-1.0,(double)(iVar2 + (int)uVar4));
        dVar10 = cofactor<double>(A,size,(int)uVar4,(int)uVar6);
        *(double *)((long)pvVar7 + uVar4 * 8) = (dVar10 / dVar8) * dVar9;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
      uVar6 = uVar6 + 1;
      pvVar7 = (void *)((long)pvVar7 + uVar5 * 8);
      iVar2 = iVar2 + 1;
    } while (uVar6 != uVar5);
    if (0 < size) {
      __n = uVar5 * 8;
      uVar3 = 0;
      do {
        memcpy(A + uVar3,(void *)((long)pvVar1 + (ulong)uVar3 * 8),__n);
        uVar3 = uVar3 + size;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
  }
  operator_delete__(pvVar1);
  return 0.0 <= dVar8;
}

Assistant:

bool Inverse(T* A, int size) {
      T* B   = new T[size*size];
      T  det = recurse_determinant<T>(A, size);

      if(det < T(0.0)) {
         delete[] B;
         return false;
      }

      for(int i=0; i<size; ++i)
         for(int j=0; j<size; ++j) {
            B[i*size + j] = pow(-1, i+j+2) * (cofactor<T>(A, size, j, i) / det);
         }

      for(int i=0; i<size; ++i)
         for(int j=0; j<size; ++j) {
            A[i*size +j] = B[i*size + j];
         }

      delete[] B;
      return true;
   }